

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AStateProvider_A_FireBullets
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  double dVar2;
  DObject *this;
  void *pvVar3;
  player_t *ppVar4;
  AWeapon *this_00;
  bool bVar5;
  int iVar6;
  int iVar7;
  PClassActor *pufftype;
  AActor *pAVar8;
  AActor *pAVar9;
  AActor *pAVar10;
  int damage;
  APlayerPawn *this_01;
  uint flags;
  char *pcVar11;
  uint flags_00;
  ulong uVar12;
  double distance;
  double dVar13;
  undefined1 auVar14 [16];
  double dVar15;
  DThinker *pDVar16;
  double dVar17;
  PClassActor *local_140;
  double local_120;
  double local_100;
  FName local_f0;
  FName local_ec;
  DThinker *local_e8;
  double dStack_e0;
  void *local_d8;
  DAngle ang;
  DVector2 ofs;
  DAngle local_90;
  DAngle local_88;
  DAngle local_80;
  DAngle local_78;
  DAngle local_70;
  FName local_64;
  FName local_60;
  FSoundID local_5c;
  DAngle local_58;
  DAngle local_50;
  DAngle local_48;
  DAngle local_40;
  DAngle local_38;
  
  if (numparam < 1) {
LAB_003ddbbb:
    pcVar11 = "(paramnum) < numparam";
    goto LAB_003ddbea;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this_01 = *(APlayerPawn **)&param->field_0;
    if ((param->field_0).field_1.atag == 1) {
      if (this_01 == (APlayerPawn *)0x0) {
LAB_003dd392:
        this_01 = (APlayerPawn *)0x0;
      }
      else {
        bVar5 = DObject::IsKindOf((DObject *)this_01,AActor::RegistrationInfo.MyClass);
        if (!bVar5) {
          pcVar11 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003ddbea;
        }
      }
      if (numparam == 1) goto LAB_003ddbbb;
      if (param[1].field_0.field_3.Type == '\x03') {
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if ((this != (DObject *)0x0) &&
             (bVar5 = DObject::IsKindOf(this,AStateProvider::RegistrationInfo.MyClass), !bVar5)) {
            pcVar11 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AStateProvider))";
            goto LAB_003ddbea;
          }
        }
        else if (this != (DObject *)0x0) goto LAB_003ddbb2;
        if ((uint)numparam < 3) goto LAB_003ddbbb;
        if (param[2].field_0.field_3.Type != '\x03') {
          pcVar11 = "param[paramnum].Type == REGT_POINTER";
          goto LAB_003ddbea;
        }
        if (numparam == 3) {
          pcVar11 = "(paramnum) < numparam";
LAB_003ddc12:
          __assert_fail(pcVar11,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x748,
                        "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        if (param[3].field_0.field_3.Type != '\x01') {
          pcVar11 = "param[paramnum].Type == REGT_FLOAT";
          goto LAB_003ddc12;
        }
        if ((uint)numparam < 5) {
          pcVar11 = "(paramnum) < numparam";
LAB_003ddc3a:
          __assert_fail(pcVar11,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x749,
                        "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        if (param[4].field_0.field_3.Type != '\x01') {
          pcVar11 = "param[paramnum].Type == REGT_FLOAT";
          goto LAB_003ddc3a;
        }
        if (numparam == 5) {
          pcVar11 = "(paramnum) < numparam";
LAB_003ddc62:
          __assert_fail(pcVar11,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x74a,
                        "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        if (param[5].field_0.field_3.Type != '\0') {
          pcVar11 = "param[paramnum].Type == REGT_INT";
          goto LAB_003ddc62;
        }
        if ((uint)numparam < 7) {
          pcVar11 = "(paramnum) < numparam";
LAB_003ddc8a:
          __assert_fail(pcVar11,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x74b,
                        "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        if (param[6].field_0.field_3.Type != '\0') {
          pcVar11 = "param[paramnum].Type == REGT_INT";
          goto LAB_003ddc8a;
        }
        pvVar3 = param[2].field_0.field_1.a;
        dVar1 = param[3].field_0.f;
        dVar2 = param[4].field_0.f;
        local_e8 = (DThinker *)CONCAT44(local_e8._4_4_,param[5].field_0.i);
        damage = param[6].field_0.i;
        if (numparam == 7) {
          param = defaultparam->Array;
          if (param[7].field_0.field_3.Type != '\x03') {
LAB_003ddd08:
            pcVar11 = 
            "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
            ;
LAB_003ddd0f:
            __assert_fail(pcVar11,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x74c,
                          "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          pufftype = (PClassActor *)param[7].field_0.field_1.a;
          if (param[7].field_0.field_1.atag != 1) {
            if (pufftype != (PClassActor *)0x0) goto LAB_003ddd08;
            pufftype = (PClassActor *)0x0;
          }
LAB_003dd4ff:
          if (param[8].field_0.field_3.Type != '\0') {
            pcVar11 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ddd37:
            __assert_fail(pcVar11,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x74d,
                          "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          flags = param[8].field_0.i;
LAB_003dd514:
          if (param[9].field_0.field_3.Type != '\x01') {
            pcVar11 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003ddcf0:
            __assert_fail(pcVar11,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x74e,
                          "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          dVar17 = param[9].field_0.f;
LAB_003dd52b:
          if (param[10].field_0.field_3.Type != '\x03') {
LAB_003ddbc4:
            pcVar11 = 
            "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
            ;
LAB_003ddbcb:
            __assert_fail(pcVar11,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x74f,
                          "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          local_140 = (PClassActor *)param[10].field_0.field_1.a;
          if (param[10].field_0.field_1.atag != 1) {
            if (local_140 != (PClassActor *)0x0) goto LAB_003ddbc4;
            local_140 = (PClassActor *)0x0;
          }
LAB_003dd555:
          if (param[0xb].field_0.field_3.Type != '\x01') {
            pcVar11 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003ddcd1:
            __assert_fail(pcVar11,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x750,
                          "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          local_100 = param[0xb].field_0.f;
        }
        else {
          if ((param[7].field_0.field_3.Type != '\x03') ||
             (pufftype = (PClassActor *)param[7].field_0.field_1.a,
             pufftype != (PClassActor *)0x0 && param[7].field_0.field_1.atag != 1)) {
            pcVar11 = 
            "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
            ;
            goto LAB_003ddd0f;
          }
          if ((uint)numparam < 9) {
            param = defaultparam->Array;
            goto LAB_003dd4ff;
          }
          if (param[8].field_0.field_3.Type != '\0') {
            pcVar11 = "(param[paramnum]).Type == REGT_INT";
            goto LAB_003ddd37;
          }
          flags = param[8].field_0.i;
          if (numparam == 9) {
            param = defaultparam->Array;
            goto LAB_003dd514;
          }
          if (param[9].field_0.field_3.Type != '\x01') {
            pcVar11 = "(param[paramnum]).Type == REGT_FLOAT";
            goto LAB_003ddcf0;
          }
          dVar17 = param[9].field_0.f;
          if ((uint)numparam < 0xb) {
            param = defaultparam->Array;
            goto LAB_003dd52b;
          }
          if ((param[10].field_0.field_3.Type != '\x03') ||
             (local_140 = (PClassActor *)param[10].field_0.field_1.a,
             local_140 != (PClassActor *)0x0 && param[10].field_0.field_1.atag != 1)) {
            pcVar11 = 
            "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
            ;
            goto LAB_003ddbcb;
          }
          if (numparam == 0xb) {
            param = defaultparam->Array;
            goto LAB_003dd555;
          }
          if (param[0xb].field_0.field_3.Type != '\x01') {
            pcVar11 = "(param[paramnum]).Type == REGT_FLOAT";
            goto LAB_003ddcd1;
          }
          local_100 = param[0xb].field_0.f;
          if (0xc < (uint)numparam) {
            if (param[0xc].field_0.field_3.Type != '\x01') {
              pcVar11 = "(param[paramnum]).Type == REGT_FLOAT";
              goto LAB_003ddcb2;
            }
            goto LAB_003dd585;
          }
          param = defaultparam->Array;
        }
        if (param[0xc].field_0.field_3.Type != '\x01') {
          pcVar11 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003ddcb2:
          __assert_fail(pcVar11,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x751,
                        "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
LAB_003dd585:
        ppVar4 = (this_01->super_AActor).player;
        if (ppVar4 != (player_t *)0x0) {
          local_d8 = param[0xc].field_0.field_1.a;
          this_00 = ppVar4->ReadyWeapon;
          if ((((pvVar3 != (void *)0x0 & (byte)flags & this_00 != (AWeapon *)0x0) != 1) ||
              (*(int *)((long)pvVar3 + 8) != 1)) ||
             (bVar5 = AWeapon::DepleteAmmo(this_00,this_00->bAltFire,true,-1), bVar5)) {
            local_120 = 0.0;
            if ((flags & 0x10) == 0) {
              APlayerPawn::PlayAttacking2(this_01);
            }
            if ((flags & 8) == 0) {
              P_BulletSlope((AActor *)&ofs,(FTranslatedLineTarget *)this_01,0);
              local_120 = ofs.X;
            }
            distance = (double)(~-(ulong)(dVar17 == 0.0) & (ulong)dVar17 |
                               -(ulong)(dVar17 == 0.0) & 0x40c0000000000000);
            dVar17 = (this_01->super_AActor).Angles.Yaw.Degrees;
            if (pufftype == (PClassActor *)0x0) {
              pufftype = PClass::FindActor(NAME_BulletPuff);
            }
            if (this_00 != (AWeapon *)0x0) {
              local_5c.ID = (this_00->super_AStateProvider).super_AInventory.super_AActor.
                            AttackSound.super_FSoundID.ID;
              S_Sound(&this_01->super_AActor,1,&local_5c,1.0,1.0);
            }
            flags_00 = flags >> 4 & 2;
            if (((int)local_e8 == 0) || (((int)local_e8 == 1 && (ppVar4->refire == 0)))) {
              if ((flags & 2) == 0) {
                iVar6 = FRandom::operator()(&pr_cwbullet);
                damage = damage * (iVar6 % 3 + 1);
              }
              local_40.Degrees = local_120;
              local_60.Index = 0xcd;
              local_38.Degrees = dVar17;
              pAVar8 = P_LineAttack(&this_01->super_AActor,&local_38,distance,&local_40,damage,
                                    &local_60,pufftype,flags_00,(FTranslatedLineTarget *)0x0,
                                    (int *)0x0);
              if (local_140 != (PClassActor *)0x0) {
                ang.Degrees = (this_01->super_AActor).Angles.Yaw.Degrees + -90.0;
                TAngle<double>::ToVector((TAngle<double> *)&ofs,(double)local_d8);
                local_48.Degrees = dVar17;
                pAVar9 = P_SpawnPlayerMissile
                                   (&this_01->super_AActor,ofs.X,ofs.Y,local_100,local_140,&local_48
                                    ,(FTranslatedLineTarget *)0x0,(AActor **)0x0,false,true,0);
                if (pAVar9 != (AActor *)0x0) {
                  pAVar10 = pAVar8;
                  if (pAVar8 == (AActor *)0x0) {
                    local_58.Degrees = local_120;
                    local_64.Index = 0xcd;
                    local_50.Degrees = dVar17;
                    pAVar10 = P_LineAttack(&this_01->super_AActor,&local_50,distance,&local_58,0,
                                           &local_64,pufftype,flags_00 | 8,
                                           (FTranslatedLineTarget *)0x0,(int *)0x0);
                  }
                  AimBulletMissile(pAVar9,pAVar10,flags,pAVar8 == (AActor *)0x0,false);
                }
              }
            }
            else {
              uVar12 = 1;
              if (-1 < (int)local_e8) {
                uVar12 = (ulong)local_e8 & 0xffffffff;
              }
              while (iVar6 = (int)uVar12, uVar12 = (ulong)(iVar6 - 1), iVar6 != 0) {
                dVar13 = dVar1;
                dVar15 = dVar2;
                if ((flags & 4) == 0) {
                  iVar6 = FRandom::Random2(&pr_cwbullet);
                  iVar7 = FRandom::Random2(&pr_cwbullet);
                  auVar14._0_8_ = (double)iVar6;
                  auVar14._8_8_ = (double)iVar7;
                  auVar14 = divpd(auVar14,_DAT_005b0220);
                  dVar13 = auVar14._0_8_ * dVar1;
                  dVar15 = auVar14._8_8_ * dVar2;
                }
                iVar6 = damage;
                local_e8 = (DThinker *)dVar13;
                dStack_e0 = dVar15;
                if ((flags & 2) == 0) {
                  iVar6 = FRandom::operator()(&pr_cwbullet);
                  iVar6 = (iVar6 % 3 + 1) * damage;
                }
                pDVar16 = (DThinker *)(dVar17 + (double)local_e8);
                local_e8 = (DThinker *)(dStack_e0 + local_120);
                local_ec.Index = 0xcd;
                local_78.Degrees = (double)local_e8;
                local_70.Degrees = (double)pDVar16;
                pAVar8 = P_LineAttack(&this_01->super_AActor,&local_70,distance,&local_78,iVar6,
                                      &local_ec,pufftype,flags_00,(FTranslatedLineTarget *)0x0,
                                      (int *)0x0);
                if (local_140 != (PClassActor *)0x0) {
                  ang.Degrees = (this_01->super_AActor).Angles.Yaw.Degrees + -90.0;
                  TAngle<double>::ToVector((TAngle<double> *)&ofs,(double)local_d8);
                  local_80.Degrees = (double)pDVar16;
                  pAVar9 = P_SpawnPlayerMissile
                                     (&this_01->super_AActor,ofs.X,ofs.Y,local_100,local_140,
                                      &local_80,(FTranslatedLineTarget *)0x0,(AActor **)0x0,false,
                                      true,0);
                  if (pAVar9 != (AActor *)0x0) {
                    pAVar10 = pAVar8;
                    if (pAVar8 == (AActor *)0x0) {
                      local_90.Degrees = (double)local_e8;
                      local_f0.Index = 0xcd;
                      local_88.Degrees = (double)pDVar16;
                      pAVar10 = P_LineAttack(&this_01->super_AActor,&local_88,distance,&local_90,0,
                                             &local_f0,pufftype,flags_00 + 8,
                                             (FTranslatedLineTarget *)0x0,(int *)0x0);
                    }
                    AimBulletMissile(pAVar9,pAVar10,flags,pAVar8 == (AActor *)0x0,false);
                  }
                }
              }
            }
          }
        }
        return 0;
      }
    }
    else if (this_01 == (APlayerPawn *)0x0) goto LAB_003dd392;
  }
LAB_003ddbb2:
  pcVar11 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_003ddbea:
  __assert_fail(pcVar11,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x747,
                "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AStateProvider, A_FireBullets)
{
	PARAM_ACTION_PROLOGUE(AStateProvider);
	PARAM_ANGLE		(spread_xy);
	PARAM_ANGLE		(spread_z);
	PARAM_INT		(numbullets);
	PARAM_INT		(damageperbullet);
	PARAM_CLASS_DEF	(pufftype, AActor);
	PARAM_INT_DEF	(flags);
	PARAM_FLOAT_DEF	(range);
	PARAM_CLASS_DEF (missile, AActor);
	PARAM_FLOAT_DEF (Spawnheight);
	PARAM_FLOAT_DEF (Spawnofs_xy);

	if (!self->player) return 0;

	player_t *player = self->player;
	AWeapon *weapon = player->ReadyWeapon;

	int i;
	DAngle bangle;
	DAngle bslope = 0.;
	int laflags = (flags & FBF_NORANDOMPUFFZ)? LAF_NORANDOMPUFFZ : 0;

	if ((flags & FBF_USEAMMO) && weapon && ACTION_CALL_FROM_PSPRITE())
	{
		if (!weapon->DepleteAmmo(weapon->bAltFire, true))
			return 0;	// out of ammo
	}
	
	if (range == 0)	range = PLAYERMISSILERANGE;

	if (!(flags & FBF_NOFLASH)) static_cast<APlayerPawn *>(self)->PlayAttacking2 ();

	if (!(flags & FBF_NOPITCH)) bslope = P_BulletSlope(self);
	bangle = self->Angles.Yaw;

	if (pufftype == NULL) pufftype = PClass::FindActor(NAME_BulletPuff);

	if (weapon != NULL)
	{
		S_Sound(self, CHAN_WEAPON, weapon->AttackSound, 1, ATTN_NORM);
	}

	if ((numbullets == 1 && !player->refire) || numbullets == 0)
	{
		int damage = damageperbullet;

		if (!(flags & FBF_NORANDOM))
			damage *= ((pr_cwbullet()%3)+1);

		AActor *puff = P_LineAttack(self, bangle, range, bslope, damage, NAME_Hitscan, pufftype, laflags);

		if (missile != nullptr)
		{
			bool temp = false;
			DAngle ang = self->Angles.Yaw - 90;
			DVector2 ofs = ang.ToVector(Spawnofs_xy);
			AActor *proj = P_SpawnPlayerMissile(self, ofs.X, ofs.Y, Spawnheight, missile, bangle, nullptr, nullptr, false, true);
			if (proj)
			{
				if (!puff)
				{
					temp = true;
					puff = P_LineAttack(self, bangle, range, bslope, 0, NAME_Hitscan, pufftype, laflags | LAF_NOINTERACT);
				}
				AimBulletMissile(proj, puff, flags, temp, false);
			}
		}
	}
	else 
	{
		if (numbullets < 0)
			numbullets = 1;
		for (i = 0; i < numbullets; i++)
		{
			DAngle angle = bangle;
			DAngle slope = bslope;

			if (flags & FBF_EXPLICITANGLE)
			{
				angle += spread_xy;
				slope += spread_z;
			}
			else
			{
				angle += spread_xy * (pr_cwbullet.Random2() / 255.);
				slope += spread_z * (pr_cwbullet.Random2() / 255.);
			}

			int damage = damageperbullet;

			if (!(flags & FBF_NORANDOM))
				damage *= ((pr_cwbullet()%3)+1);

			AActor *puff = P_LineAttack(self, angle, range, slope, damage, NAME_Hitscan, pufftype, laflags);

			if (missile != nullptr)
			{
				bool temp = false;
				DAngle ang = self->Angles.Yaw - 90;
				DVector2 ofs = ang.ToVector(Spawnofs_xy);
				AActor *proj = P_SpawnPlayerMissile(self, ofs.X, ofs.Y, Spawnheight, missile, angle, nullptr, nullptr, false, true);
				if (proj)
				{
					if (!puff)
					{
						temp = true;
						puff = P_LineAttack(self, angle, range, slope, 0, NAME_Hitscan, pufftype, laflags | LAF_NOINTERACT);
					}
					AimBulletMissile(proj, puff, flags, temp, false);
				}
			}
		}
	}
	return 0;
}